

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void prof_appraise(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  OBJ_DATA *arg1;
  CProficiencies *pCVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  float fVar4;
  float fVar5;
  string_view fmt;
  format_args args;
  string buffer;
  ulong local_38 [3];
  
  if ((*argument != '\0') && (arg1 = get_obj_carry(ch,argument,ch), arg1 != (OBJ_DATA *)0x0)) {
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar3 = &prof_none;
    }
    else {
      pCVar3 = &ch->pcdata->profs;
    }
    iVar1 = CProficiencies::GetProf(pCVar3,"appraising");
    iVar2 = number_percent();
    fVar4 = (float)((iVar2 * (10 - iVar1)) / 0x4b0);
    iVar1 = number_percent();
    fVar5 = (float)arg1->cost;
    if (iVar1 < 0x33) {
      fVar5 = fVar5 - fVar4 * fVar5;
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
    }
    else {
      fVar5 = fVar4 * fVar5 + fVar5;
    }
    local_38[0] = (ulong)(uint)(int)fVar5;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x39;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_38;
    ::fmt::v9::vformat_abi_cxx11_
              (&buffer,(v9 *)"You estimate the value of $p to be approximately {} gold.",fmt,args);
    act(buffer._M_dataplus._M_p,ch,arg1,(void *)0x0,3);
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar3 = &prof_none;
    }
    else {
      pCVar3 = &ch->pcdata->profs;
    }
    CProficiencies::CheckImprove(pCVar3,"appraising",0x50);
    WAIT_STATE(ch,0xc);
    std::__cxx11::string::~string((string *)&buffer);
    return;
  }
  send_to_char("You aren\'t carrying that.\n\r",ch);
  return;
}

Assistant:

void prof_appraise(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	if (argument[0] == '\0' || !(obj = get_obj_carry(ch, argument, ch)))
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	float mcost = (10 - ch->Profs()->GetProf("appraising")) * number_percent() / 1200;
	float tcost = number_percent() > 50
		? obj->cost + (mcost * obj->cost)
		: std::max((float)0, obj->cost - (mcost * obj->cost));

	auto buffer = fmt::format("You estimate the value of $p to be approximately {} gold.", (int)tcost);
	act(buffer.c_str(), ch, obj, 0, TO_CHAR);
	ch->Profs()->CheckImprove("appraising", 80);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}